

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluHashFindMedian(If_Man_t *p,int t)

{
  int iVar1;
  Vec_Int_t *p_00;
  int local_38;
  int local_34;
  int Half;
  int Total;
  int Max;
  int i;
  Vec_Int_t *vCounters;
  If_Hte_t *pEntry;
  int t_local;
  If_Man_t *p_local;
  
  Half = 0;
  local_34 = 0;
  local_38 = 0;
  p_00 = Vec_IntStart(1000);
  for (Total = 0; Total < p->nTableSize[t]; Total = Total + 1) {
    for (vCounters = (Vec_Int_t *)p->pHashTable[t][Total]; vCounters != (Vec_Int_t *)0x0;
        vCounters = *(Vec_Int_t **)vCounters) {
      if (Half < *(int *)((long)&vCounters->pArray + 4)) {
        Half = *(int *)((long)&vCounters->pArray + 4);
        Vec_IntSetEntry(p_00,*(int *)((long)&vCounters->pArray + 4),0);
      }
      Vec_IntAddToEntry(p_00,*(int *)((long)&vCounters->pArray + 4),1);
      local_34 = local_34 + 1;
    }
  }
  for (Total = Half; 0 < Total; Total = Total + -1) {
    iVar1 = Vec_IntEntry(p_00,Total);
    local_38 = iVar1 + local_38;
    if (local_34 / 2 < local_38) break;
  }
  Vec_IntFree(p_00);
  iVar1 = Abc_MaxInt(Total,1);
  return iVar1;
}

Assistant:

int If_CluHashFindMedian( If_Man_t * p, int t )
{
    If_Hte_t * pEntry;
    Vec_Int_t * vCounters;
    int i, Max = 0, Total = 0, Half = 0;
    vCounters = Vec_IntStart( 1000 );
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
        {
            if ( Max < (int)pEntry->Counter )
            {
                Max = pEntry->Counter;
                Vec_IntSetEntry( vCounters, pEntry->Counter, 0 );
            }
            Vec_IntAddToEntry( vCounters, pEntry->Counter, 1 );
            Total++;
        }
    }
    for ( i = Max; i > 0; i-- )
    {
        Half += Vec_IntEntry( vCounters, i );
        if ( Half > Total/2 )
            break;
    }
/*
    printf( "total = %d  ", Total );
    printf( "half = %d  ", Half );
    printf( "i = %d  ", i );
    printf( "Max = %d.\n", Max );
*/
    Vec_IntFree( vCounters );
    return Abc_MaxInt( i, 1 );
}